

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

bool_t hexEqRev(void *buf,char *hex)

{
  uint uVar1;
  size_t sVar2;
  byte bVar3;
  
  sVar2 = strLen(hex);
  if (sVar2 == 0) {
    uVar1 = 1;
  }
  else {
    bVar3 = 0;
    do {
      bVar3 = bVar3 | (hex_dec_table[(byte)hex[sVar2 - 2]] << 4 |
                      hex_dec_table[(byte)hex[sVar2 - 1]]) ^ *buf;
      buf = (void *)((long)buf + 1);
      sVar2 = sVar2 - 2;
    } while (sVar2 != 0);
    uVar1 = (uint)(bVar3 == 0);
  }
  return uVar1;
}

Assistant:

bool_t SAFE(hexEqRev)(const void* buf, const char* hex)
{
	register word diff = 0;
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	hex = hex + count;
	for (; count; count -= 2, buf = (const octet*)buf + 1)
		diff |= *(const octet*)buf ^ hexToO(hex -= 2);
	return wordEq(diff, 0);
}